

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O2

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,SubscriptWithChevrons *s)

{
  Expression *pEVar1;
  undefined8 extraout_RDX;
  
  (*this->_vptr_ASTVisitor[3])(this,(s->lhs).object);
  pEVar1 = pool_ptr<soul::AST::Expression>::operator*(&s->rhs);
  (*this->_vptr_ASTVisitor[3])(this,pEVar1,extraout_RDX,this->_vptr_ASTVisitor[3]);
  return;
}

Assistant:

virtual void visit (AST::SubscriptWithChevrons& s)
    {
        visitObject (s.lhs);
        visitObject (*s.rhs);
    }